

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasDrawRectA(int x1,int y1,int x2,int y2,double alpha,Canvas *ptr)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  
  if (ptr != (Canvas *)0x0) {
    if (x1 < 1) {
      x1 = 0;
    }
    iVar1 = ptr->width;
    if (iVar1 < x2) {
      x2 = iVar1;
    }
    uVar3 = 0;
    if (0 < y1) {
      uVar3 = (ulong)(uint)y1;
    }
    dVar9 = 1.0 - alpha;
    iVar5 = ((int)uVar3 * iVar1 + x1) * 4;
    for (; x1 < x2; x1 = x1 + 1) {
      iVar6 = ptr->height;
      if (y2 <= ptr->height) {
        iVar6 = y2;
      }
      iVar7 = iVar5;
      for (uVar4 = uVar3; (long)uVar4 < (long)iVar6; uVar4 = uVar4 + 1) {
        pcVar2 = (ptr->data).ptr;
        lVar8 = (long)iVar7;
        *(float *)(pcVar2 + lVar8 * 4) =
             (float)((double)ptr->color[0] * alpha + (double)*(float *)(pcVar2 + lVar8 * 4) * dVar9)
        ;
        *(float *)(pcVar2 + lVar8 * 4 + 4) =
             (float)((double)ptr->color[1] * alpha +
                    (double)*(float *)(pcVar2 + lVar8 * 4 + 4) * dVar9);
        *(float *)(pcVar2 + lVar8 * 4 + 8) =
             (float)((double)ptr->color[2] * alpha +
                    (double)*(float *)(pcVar2 + lVar8 * 4 + 8) * dVar9);
        pcVar2 = pcVar2 + lVar8 * 4 + 0xc;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = -0x80;
        pcVar2[3] = '?';
        iVar7 = iVar7 + iVar1 * 4;
      }
      iVar5 = iVar5 + 4;
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasDrawRectA(int x1, int y1, int x2, int y2, double alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		for(int x = x1 < 0 ? 0 : x1, xe = x2 > ptr->width ? ptr->width : x2; x < xe; x++)
		{
			for(int y = y1 < 0 ? 0 : y1, ye = y2 > ptr->height ? ptr->height : y2; y < ye; y++)
			{
				float *pixel = &((float*)ptr->data.ptr)[y * ptr->width * 4 + x * 4];

				pixel[0] = float(ptr->color[0] * alpha + pixel[0] * (1.0 - alpha));
				pixel[1] = float(ptr->color[1] * alpha + pixel[1] * (1.0 - alpha));
				pixel[2] = float(ptr->color[2] * alpha + pixel[2] * (1.0 - alpha));
				pixel[3] = 1.0f;
			}
		}
	}